

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::statistics(tetgenmesh *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long local_28;
  long vsize;
  long facenumber;
  long tetnumber;
  tetgenmesh *this_local;
  
  printf("\nStatistics:\n\n");
  printf("  Input points: %d\n",(ulong)(uint)this->in->numberofpoints);
  if (this->b->refine == 0) {
    if (this->b->plc != 0) {
      printf("  Input facets: %d\n",(ulong)(uint)this->in->numberoffacets);
      printf("  Input segments: %ld\n",this->insegments);
      if (0 < this->in->numberofedges) {
        printf("  Input edges: %d\n",(ulong)(uint)this->in->numberofedges);
      }
      printf("  Input holes: %d\n",(ulong)(uint)this->in->numberofholes);
      printf("  Input regions: %d\n",(ulong)(uint)this->in->numberofregions);
    }
  }
  else {
    printf("  Input tetrahedra: %d\n",(ulong)(uint)this->in->numberoftetrahedra);
    if (0 < this->in->numberoftrifaces) {
      printf("  Input triangles: %d\n",(ulong)(uint)this->in->numberoftrifaces);
    }
    if (0 < this->in->numberofedges) {
      printf("  Input edges: %d\n",(ulong)(uint)this->in->numberofedges);
    }
  }
  lVar1 = this->tetrahedrons->items - this->hullsize;
  lVar2 = lVar1 * 4 + this->hullsize;
  lVar3 = lVar2 / 2;
  lVar2 = lVar2 % 2;
  if (this->b->weighted == 0) {
    printf("\n  Mesh points: %ld\n",this->points->items,lVar2);
  }
  else {
    printf("\n  Mesh points: %ld\n",this->points->items - this->nonregularcount,lVar2);
  }
  printf("  Mesh tetrahedra: %ld\n",lVar1);
  printf("  Mesh faces: %ld\n",lVar3);
  if (this->meshedges < 1) {
    if (this->nonconvex == 0) {
      local_28 = (this->points->items - this->dupverts) - this->unuverts;
      if (this->b->weighted != 0) {
        local_28 = local_28 - this->nonregularcount;
      }
      this->meshedges = ((local_28 + lVar3) - lVar1) + -1;
      printf("  Mesh edges: %ld\n",this->meshedges);
    }
  }
  else {
    printf("  Mesh edges: %ld\n",this->meshedges);
  }
  if ((this->b->plc == 0) && (this->b->refine == 0)) {
    printf("  Convex hull faces: %ld\n",this->hullsize);
    if (0 < this->meshhulledges) {
      printf("  Convex hull edges: %ld\n",this->meshhulledges);
    }
  }
  else {
    printf("  Mesh faces on exterior boundary: %ld\n",this->hullsize);
    if (0 < this->meshhulledges) {
      printf("  Mesh edges on exterior boundary: %ld\n",this->meshhulledges);
    }
    printf("  Mesh faces on input facets: %ld\n",this->subfaces->items);
    printf("  Mesh edges on input segments: %ld\n",this->subsegs->items);
    if (0 < this->st_facref_count) {
      printf("  Steiner points on input facets:  %ld\n",this->st_facref_count);
    }
    if (0 < this->st_segref_count) {
      printf("  Steiner points on input segments:  %ld\n",this->st_segref_count);
    }
    if (0 < this->st_volref_count) {
      printf("  Steiner points inside domain: %ld\n",this->st_volref_count);
    }
  }
  if (this->b->weighted != 0) {
    printf("  Skipped non-regular points: %ld\n",this->nonregularcount);
  }
  printf("\n");
  if (0 < this->b->verbose) {
    if (((this->b->plc != 0) || (this->b->refine != 0)) && (0 < this->tetrahedrons->items)) {
      qualitystatistics(this);
    }
    if (0 < this->tetrahedrons->items) {
      memorystatistics(this);
    }
  }
  return;
}

Assistant:

void tetgenmesh::statistics()
{
  long tetnumber, facenumber;

  printf("\nStatistics:\n\n");
  printf("  Input points: %d\n", in->numberofpoints);
  if (b->refine) {
    printf("  Input tetrahedra: %d\n", in->numberoftetrahedra);
    if (in->numberoftrifaces > 0) {
	  printf("  Input triangles: %d\n", in->numberoftrifaces);
    }
    if (in->numberofedges > 0) {
	  printf("  Input edges: %d\n", in->numberofedges);
	}
  } else if (b->plc) {
    printf("  Input facets: %d\n", in->numberoffacets);
    printf("  Input segments: %ld\n", insegments);
	if (in->numberofedges > 0) {
	  printf("  Input edges: %d\n", in->numberofedges);
	}
    printf("  Input holes: %d\n", in->numberofholes);
    printf("  Input regions: %d\n", in->numberofregions);
  }

  tetnumber = tetrahedrons->items - hullsize;
  facenumber = (tetnumber * 4l + hullsize) / 2l;

  if (b->weighted) { // -w option
    printf("\n  Mesh points: %ld\n", points->items - nonregularcount);
  } else {
    printf("\n  Mesh points: %ld\n", points->items);
  }
  printf("  Mesh tetrahedra: %ld\n", tetnumber);
  printf("  Mesh faces: %ld\n", facenumber);
  if (meshedges > 0l) {
    printf("  Mesh edges: %ld\n", meshedges);
  } else {
    if (!nonconvex) {
      long vsize = points->items - dupverts - unuverts;
      if (b->weighted) vsize -= nonregularcount;
      meshedges = vsize + facenumber - tetnumber - 1;
      printf("  Mesh edges: %ld\n", meshedges);
    }
  }

  if (b->plc || b->refine) {
    printf("  Mesh faces on exterior boundary: %ld\n", hullsize);
    if (meshhulledges > 0l) {
      printf("  Mesh edges on exterior boundary: %ld\n", meshhulledges);
    }
    printf("  Mesh faces on input facets: %ld\n", subfaces->items);
    printf("  Mesh edges on input segments: %ld\n", subsegs->items);
    if (st_facref_count > 0l) {
      printf("  Steiner points on input facets:  %ld\n", st_facref_count);
    }
    if (st_segref_count > 0l) {
      printf("  Steiner points on input segments:  %ld\n", st_segref_count);
    }
    if (st_volref_count > 0l) {
      printf("  Steiner points inside domain: %ld\n", st_volref_count);
    }
  } else {
    printf("  Convex hull faces: %ld\n", hullsize);
    if (meshhulledges > 0l) {
      printf("  Convex hull edges: %ld\n", meshhulledges);
    }
  }
  if (b->weighted) { // -w option
    printf("  Skipped non-regular points: %ld\n", nonregularcount);
  }
  printf("\n");


  if (b->verbose > 0) {
    if (b->plc || b->refine) { // -p or -r
      if (tetrahedrons->items > 0l) {
        qualitystatistics();
      }
    }
    if (tetrahedrons->items > 0l) {
      memorystatistics();
    }
  }
}